

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>,true>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  ProfileId profileId;
  ArgSlot argCount;
  uint localRegisterID;
  Type ppvVar1;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  long lVar2;
  RegSlotSType RVar3;
  AuxArray<unsigned_int> *spreadIndices_00;
  uint uVar4;
  Var pvVar5;
  void **__s;
  uint uVar6;
  Type TVar7;
  void *apvStack_e0 [2];
  Var stackArgs [8];
  Arguments local_90;
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  Arguments local_50;
  AuxArray<unsigned_int> *local_40;
  Type local_38;
  
  __s = apvStack_e0 + 1;
  TVar7 = (Type)((ulong)playout->ArgCount | 0x1000000);
  ppvVar1 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    uVar6 = playout->Return;
    apvStack_e0[0] = (void *)0x97bf50;
    pvVar5 = GetReg<unsigned_int>(this,playout->Function);
    apvStack_e0[0] = (void *)0x97bf74;
    local_60.Info = TVar7;
    local_60.Values = ppvVar1;
    pvVar5 = ProfilingHelpers::ProfiledNewScObjArray
                       (pvVar5,&local_60,*(ScriptFunction **)(this + 0x80),playout[1].ArgCount,
                        (ProfileId)playout[1].Return);
  }
  else {
    apvStack_e0[0] = (void *)0x97bee1;
    local_90.Info = TVar7;
    local_90.Values = ppvVar1;
    local_40 = spreadIndices;
    local_38 = ppvVar1;
    uVar4 = JavascriptFunction::GetSpreadSize
                      (&local_90,spreadIndices,*(ScriptContext **)(this + 0x78));
    uVar6 = (uVar4 & 0xffffff) + 0x1000000;
    local_50.Info._4_4_ = 0;
    local_50.Info._0_4_ = uVar6;
    if ((uVar4 & 0xffffff) < 9) {
      __s = apvStack_e0 + 1;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      apvStack_e0[1] = (void *)0x0;
      stackArgs[0] = (Var)0x0;
    }
    else {
      uVar6 = uVar6 * 8 & 0x7fffff8;
      apvStack_e0[0] = (void *)0x97bf1f;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,(ulong)uVar6 + 0xc00,
                 *(ScriptContext **)(this + 0x78),(PVOID)0x0);
      lVar2 = -(ulong)(uVar6 + 0xf & 0xfffffff0);
      __s = (void **)((long)stackArgs + lVar2 + -8);
      *(undefined8 *)((long)apvStack_e0 + lVar2) = 0x97bf3e;
      memset(__s,0,(ulong)uVar6);
    }
    spreadIndices_00 = local_40;
    local_80.Values = local_38;
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_80.Info = TVar7;
    local_50.Values = __s;
    __s[-1] = (void *)0x97bfc5;
    JavascriptFunction::SpreadArgs(&local_80,&local_50,spreadIndices_00,scriptContext);
    uVar6 = playout->Return;
    localRegisterID = playout->Function;
    __s[-1] = (void *)0x97bfd5;
    pvVar5 = GetReg<unsigned_int>(this,localRegisterID);
    local_70.Info = local_50.Info;
    local_70.Values = local_50.Values;
    caller = *(ScriptFunction **)(this + 0x80);
    profileId = playout[1].ArgCount;
    RVar3 = playout[1].Return;
    __s[-1] = (void *)0x97bffa;
    pvVar5 = ProfilingHelpers::ProfiledNewScObjArray
                       (pvVar5,&local_70,caller,profileId,(ProfileId)RVar3);
  }
  __s[-1] = (void *)0x97c008;
  SetReg<unsigned_int>(this,uVar6,pvVar5);
  argCount = playout->ArgCount;
  __s[-1] = (void *)0x97c014;
  PopOut(this,argCount);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }